

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall
spvtools::opt::Instruction::Instruction
          (Instruction *this,IRContext *c,spv_parsed_instruction_t *inst,
          vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> *dbg_line)

{
  bool bVar1;
  bool bVar2;
  uint32_t uVar3;
  uint *local_48;
  uint *local_40;
  _func_int ***local_38;
  spv_parsed_operand_t *current_payload;
  vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> *pvStack_28;
  uint32_t i;
  vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> *dbg_line_local;
  spv_parsed_instruction_t *inst_local;
  IRContext *c_local;
  Instruction *this_local;
  
  pvStack_28 = dbg_line;
  dbg_line_local =
       (vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_> *)inst;
  inst_local = (spv_parsed_instruction_t *)c;
  c_local = (IRContext *)this;
  utils::IntrusiveNodeBase<spvtools::opt::Instruction>::IntrusiveNodeBase
            (&this->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
  (this->super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase =
       (_func_int **)&PTR__Instruction_00827bf0;
  this->context_ = (IRContext *)inst_local;
  this->opcode_ =
       (uint)*(ushort *)
              ((long)&(dbg_line_local->
                      super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                      )._M_impl.super__Vector_impl_data._M_finish + 2);
  this->has_type_id_ =
       *(int *)&(dbg_line_local->
                super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                )._M_impl.super__Vector_impl_data._M_end_of_storage != 0;
  this->has_result_id_ =
       *(int *)((long)&(dbg_line_local->
                       super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                       )._M_impl.super__Vector_impl_data._M_end_of_storage + 4) != 0;
  uVar3 = IRContext::TakeNextUniqueId((IRContext *)inst_local);
  this->unique_id_ = uVar3;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            (&this->operands_);
  std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::vector
            (&this->dbg_line_insts_,pvStack_28);
  DebugScope::DebugScope(&this->dbg_scope_,0,0);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::reserve
            (&this->operands_,
             (ulong)*(ushort *)
                     &dbg_line_local[1].
                      super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
  for (current_payload._4_4_ = 0;
      current_payload._4_4_ <
      *(ushort *)
       &dbg_line_local[1].
        super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
        _M_impl.super__Vector_impl_data._M_finish; current_payload._4_4_ = current_payload._4_4_ + 1
      ) {
    local_38 = &((dbg_line_local[1].
                  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super_IntrusiveNodeBase<spvtools::opt::Instruction>)._vptr_IntrusiveNodeBase +
               (ulong)current_payload._4_4_ * 2;
    local_40 = (uint *)((long)&(((dbg_line_local->
                                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->
                               super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                               _vptr_IntrusiveNodeBase + (long)(int)(uint)*(ushort *)local_38 * 4);
    local_48 = (uint *)((long)&(((dbg_line_local->
                                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->
                               super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                               _vptr_IntrusiveNodeBase +
                       (long)(int)(uint)*(ushort *)((long)local_38 + 2) * 4 +
                       (long)(int)(uint)*(ushort *)local_38 * 4);
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    emplace_back<spv_operand_type_t_const&,unsigned_int_const*,unsigned_int_const*>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
               &this->operands_,(spv_operand_type_t *)((long)local_38 + 4),&local_40,&local_48);
  }
  bVar1 = IsLineInst(this);
  if (bVar1) {
    bVar2 = std::vector<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>::
            empty(pvStack_28);
    bVar1 = false;
    if (!bVar2) goto LAB_003aa7d0;
  }
  bVar1 = true;
LAB_003aa7d0:
  if (bVar1) {
    return;
  }
  __assert_fail("(!IsLineInst() || dbg_line.empty()) && \"Op(No)Line attaching to Op(No)Line found\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.cpp"
                ,0x54,
                "spvtools::opt::Instruction::Instruction(IRContext *, const spv_parsed_instruction_t &, std::vector<Instruction> &&)"
               );
}

Assistant:

Instruction::Instruction(IRContext* c, const spv_parsed_instruction_t& inst,
                         std::vector<Instruction>&& dbg_line)
    : utils::IntrusiveNodeBase<Instruction>(),
      context_(c),
      opcode_(static_cast<spv::Op>(inst.opcode)),
      has_type_id_(inst.type_id != 0),
      has_result_id_(inst.result_id != 0),
      unique_id_(c->TakeNextUniqueId()),
      dbg_line_insts_(std::move(dbg_line)),
      dbg_scope_(kNoDebugScope, kNoInlinedAt) {
  operands_.reserve(inst.num_operands);
  for (uint32_t i = 0; i < inst.num_operands; ++i) {
    const auto& current_payload = inst.operands[i];
    operands_.emplace_back(
        current_payload.type, inst.words + current_payload.offset,
        inst.words + current_payload.offset + current_payload.num_words);
  }
  assert((!IsLineInst() || dbg_line.empty()) &&
         "Op(No)Line attaching to Op(No)Line found");
}